

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O3

UriBool uriRemoveDotSegmentsExW
                  (UriUriW *uri,UriBool relative,UriBool pathOwned,UriMemoryManager *memory)

{
  UriPathSegmentW **ppUVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  void *pvVar4;
  UriPathSegmentW *pUVar5;
  int iVar6;
  UriPathSegmentW **ppUVar7;
  wchar_t *pwVar8;
  UriPathSegmentW *pUVar9;
  UriPathSegmentW *pUVar10;
  UriPathSegmentW *segment;
  UriPathSegmentStructW *pUVar11;
  
  if ((uri != (UriUriW *)0x0) && (pUVar10 = uri->pathHead, pUVar10 != (UriPathSegmentW *)0x0)) {
    ppUVar1 = &uri->pathHead;
    pUVar10->reserved = (void *)0x0;
    do {
      pwVar2 = (pUVar10->text).first;
      pwVar3 = (pUVar10->text).afterLast;
      iVar6 = (int)((ulong)((long)pwVar3 - (long)pwVar2) >> 2);
      if (iVar6 == 2) {
        if ((*pwVar2 != L'.') || (pwVar2[1] != L'.')) goto LAB_001b6eda;
        pUVar11 = pUVar10->next;
        pUVar9 = (UriPathSegmentW *)pUVar10->reserved;
        if (relative == 0) {
          if (pUVar9 == (UriPathSegmentW *)0x0) {
            if (pUVar11 == (UriPathSegmentStructW *)0x0) {
              if (uri->absolutePath == 0) {
                if ((pathOwned != 0) && (pwVar2 != pwVar3)) {
                  (*memory->free)(memory,pwVar2);
                }
                goto LAB_001b710b;
              }
              *ppUVar1 = (UriPathSegmentW *)0x0;
              uri->pathTail = (UriPathSegmentW *)0x0;
            }
            else {
              *ppUVar1 = pUVar11;
              pUVar11->reserved = (void *)0x0;
            }
            goto LAB_001b6e80;
          }
        }
        else if ((pUVar9 == (UriPathSegmentW *)0x0) ||
                (((pwVar8 = (pUVar9->text).first, (long)(pUVar9->text).afterLast - (long)pwVar8 == 8
                  && (*pwVar8 == L'.')) && (pwVar8[1] == L'.')))) goto LAB_001b6eda;
        pvVar4 = pUVar9->reserved;
        if (pvVar4 == (void *)0x0) {
          if (pUVar11 == (UriPathSegmentStructW *)0x0) {
            if ((pathOwned != 0) && (pwVar2 != pwVar3)) {
              (*memory->free)(memory,pwVar2);
            }
            (pUVar10->text).first = anon_var_dwarf_f85ea;
            (pUVar10->text).afterLast = anon_var_dwarf_f85ea;
            uri->pathHead = pUVar10;
            uri->pathTail = pUVar10;
          }
          else {
            *ppUVar1 = pUVar11;
            pUVar11->reserved = (void *)0x0;
            if ((pathOwned != 0) && (pwVar2 != pwVar3)) {
              (*memory->free)(memory,pwVar2);
            }
            (*memory->free)(memory,pUVar10);
          }
          if (pathOwned == 0) goto LAB_001b703b;
LAB_001b7025:
          pUVar10 = (UriPathSegmentW *)(pUVar9->text).first;
          if (pUVar10 == (UriPathSegmentW *)(pUVar9->text).afterLast) goto LAB_001b703b;
        }
        else {
          *(UriPathSegmentStructW **)((long)pvVar4 + 0x10) = pUVar11;
          if (pUVar10->next == (UriPathSegmentStructW *)0x0) {
            pUVar5 = (UriPathSegmentW *)(*memory->calloc)(memory,1,0x20);
            if (pUVar5 == (UriPathSegmentW *)0x0) {
              if (pathOwned != 0) {
                pwVar2 = (pUVar10->text).first;
                if (pwVar2 != (pUVar10->text).afterLast) {
                  (*memory->free)(memory,pwVar2);
                }
                (*memory->free)(memory,pUVar10);
                pUVar10 = (UriPathSegmentW *)(pUVar9->text).first;
                if (pUVar10 == (UriPathSegmentW *)(pUVar9->text).afterLast) goto LAB_001b7129;
              }
              (*memory->free)(memory,pUVar10);
LAB_001b7129:
              (*memory->free)(memory,pUVar9);
              return 0;
            }
            (pUVar5->text).first = anon_var_dwarf_f85ea;
            (pUVar5->text).afterLast = anon_var_dwarf_f85ea;
            *(UriPathSegmentW **)((long)pvVar4 + 0x10) = pUVar5;
            uri->pathTail = pUVar5;
          }
          else {
            pUVar10->next->reserved = pvVar4;
          }
          if (pathOwned != 0) {
            pwVar2 = (pUVar10->text).first;
            if (pwVar2 != (pUVar10->text).afterLast) {
              (*memory->free)(memory,pwVar2);
            }
            (*memory->free)(memory,pUVar10);
            goto LAB_001b7025;
          }
        }
        (*memory->free)(memory,pUVar10);
LAB_001b703b:
        (*memory->free)(memory,pUVar9);
        pUVar10 = pUVar11;
      }
      else {
        if ((iVar6 == 1) && (*pwVar2 == L'.')) {
          pUVar11 = pUVar10->next;
          pvVar4 = pUVar10->reserved;
          if ((relative == 0) || (pUVar11 == (UriPathSegmentStructW *)0x0 || pUVar10 != *ppUVar1)) {
            if (pUVar11 == (UriPathSegmentStructW *)0x0) {
              if ((pathOwned != 0) && (pwVar2 != pwVar3)) {
                (*memory->free)(memory,pwVar2);
              }
              if ((((pvVar4 == (void *)0x0) && ((uri->hostText).first == (wchar_t *)0x0)) &&
                  ((uri->hostData).ip4 == (UriIp4 *)0x0)) &&
                 (((uri->hostData).ip6 == (UriIp6 *)0x0 &&
                  ((uri->hostData).ipFuture.first == (wchar_t *)0x0)))) {
                (*memory->free)(memory,pUVar10);
                *ppUVar1 = (UriPathSegmentW *)0x0;
                uri->pathTail = (UriPathSegmentW *)0x0;
                return 1;
              }
LAB_001b710b:
              (pUVar10->text).first = anon_var_dwarf_f85ea;
              (pUVar10->text).afterLast = anon_var_dwarf_f85ea;
              return 1;
            }
          }
          else {
            for (pwVar8 = (pUVar11->text).first; pwVar8 < (pUVar11->text).afterLast;
                pwVar8 = pwVar8 + 1) {
              if (*pwVar8 == L':') goto LAB_001b6eda;
            }
          }
          ppUVar7 = (UriPathSegmentW **)((long)pvVar4 + 0x10);
          if (pvVar4 == (void *)0x0) {
            ppUVar7 = ppUVar1;
          }
          pUVar11->reserved = pvVar4;
          *ppUVar7 = pUVar11;
LAB_001b6e80:
          pUVar9 = pUVar10;
          if ((pathOwned != 0) && (pwVar2 != pwVar3)) {
            (*memory->free)(memory,pwVar2);
          }
          goto LAB_001b703b;
        }
LAB_001b6eda:
        pUVar11 = pUVar10->next;
        if (pUVar11 == (UriPathSegmentStructW *)0x0) {
          uri->pathTail = pUVar10;
          return 1;
        }
        pUVar11->reserved = pUVar10;
        pUVar10 = pUVar11;
      }
    } while (pUVar10 != (UriPathSegmentStructW *)0x0);
  }
  return 1;
}

Assistant:

UriBool URI_FUNC(RemoveDotSegmentsEx)(URI_TYPE(Uri) * uri,
		UriBool relative, UriBool pathOwned, UriMemoryManager * memory) {
	URI_TYPE(PathSegment) * walker;
	if ((uri == NULL) || (uri->pathHead == NULL)) {
		return URI_TRUE;
	}

	walker = uri->pathHead;
	walker->reserved = NULL; /* Prev pointer */
	do {
		UriBool removeSegment = URI_FALSE;
		int len = (int)(walker->text.afterLast - walker->text.first);
		switch (len) {
		case 1:
			if ((walker->text.first)[0] == _UT('.')) {
				/* "." segment -> remove if not essential */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				/*
				 * Is this dot segment essential,
				 * i.e. is there a chance of changing semantics by dropping this dot segment?
				 *
				 * For example, changing "./http://foo" into "http://foo" would change semantics
				 * and hence the dot segment is essential to that case and cannot be removed.
				 */
				removeSegment = URI_TRUE;
				if (relative && (walker == uri->pathHead) && (walker->next != NULL)) {
					const URI_CHAR * ch = walker->next->text.first;
					for (; ch < walker->next->text.afterLast; ch++) {
						if (*ch == _UT(':')) {
							removeSegment = URI_FALSE;
							break;
						}
					}
				}

				if (removeSegment) {
					/* .. then let's go remove that segment. */
					/* Last segment? */
					if (walker->next != NULL) {
						/* Not last segment, i.e. first or middle segment
						 * OLD: (prev|NULL) <- walker <- next
						 * NEW: (prev|NULL) <----------- next */
						walker->next->reserved = prev;

						if (prev == NULL) {
							/* First but not last segment
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;
						} else {
							/* Middle segment
							 * OLD: prev -> walker -> next
							 * NEW: prev -----------> next */
							prev->next = walker->next;
						}

						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}
						memory->free(memory, walker);
					} else {
						/* Last segment */
						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}

						if (prev == NULL) {
							/* Last and first */
							if (URI_FUNC(IsHostSet)(uri)) {
								/* Replace "." with empty segment to represent trailing slash */
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
							} else {
								memory->free(memory, walker);

								uri->pathHead = NULL;
								uri->pathTail = NULL;
							}
						} else {
							/* Last but not first, replace "." with empty segment to represent trailing slash */
							walker->text.first = URI_FUNC(SafeToPointTo);
							walker->text.afterLast = URI_FUNC(SafeToPointTo);
						}
					}

					walker = nextBackup;
				}
			}
			break;

		case 2:
			if (((walker->text.first)[0] == _UT('.'))
					&& ((walker->text.first)[1] == _UT('.'))) {
				/* Path ".." -> remove this and the previous segment */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * prevPrev;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				removeSegment = URI_TRUE;
				if (relative) {
					if (prev == NULL) {
						/* We cannot remove traversal beyond because the
						 * URI is relative and may be resolved later.
						 * So we can simplify "a/../b/d" to "b/d" but
						 * we cannot simplify "../b/d" (outside of reference resolution). */
						removeSegment = URI_FALSE;
					} else if ((prev != NULL)
							&& ((prev->text.afterLast - prev->text.first) == 2)
							&& ((prev->text.first)[0] == _UT('.'))
							&& ((prev->text.first)[1] == _UT('.'))) {
						/* We need to protect against mis-simplifying "a/../../b" to "a/b". */
						removeSegment = URI_FALSE;
					}
				}

				if (removeSegment) {
					if (prev != NULL) {
						/* Not first segment */
						prevPrev = prev->reserved;
						if (prevPrev != NULL) {
							/* Not even prev is the first one
							 * OLD: prevPrev -> prev -> walker -> (next|NULL)
							 * NEW: prevPrev -------------------> (next|NULL) */
							prevPrev->next = walker->next;
							if (walker->next != NULL) {
								/* Update parent relationship as well
								 * OLD: prevPrev <- prev <- walker <- next
								 * NEW: prevPrev <------------------- next */
								walker->next->reserved = prevPrev;
							} else {
								/* Last segment -> insert "" segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = memory->calloc(memory, 1, sizeof(URI_TYPE(PathSegment)));
								if (segment == NULL) {
									if (pathOwned && (walker->text.first != walker->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)walker->text.first);
									}
									memory->free(memory, walker);

									if (pathOwned && (prev->text.first != prev->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)prev->text.first);
									}
									memory->free(memory, prev);

									return URI_FALSE; /* Raises malloc error */
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								prevPrev->next = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						} else {
							/* Prev is the first segment */
							if (walker->next != NULL) {
								uri->pathHead = walker->next;
								walker->next->reserved = NULL;

								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								memory->free(memory, walker);
							} else {
								/* Re-use segment for "" path segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = walker;
								if (pathOwned && (segment->text.first != segment->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)segment->text.first);
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								uri->pathHead = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						}
					} else {
						URI_TYPE(PathSegment) * const anotherNextBackup = walker->next;
						int freeWalker = URI_TRUE;

						/* First segment */
						if (walker->next != NULL) {
							/* First segment of multiple -> update head
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;

							/* Update parent link as well
							 * OLD: head <- walker <- next
							 * NEW: head <----------- next */
							walker->next->reserved = NULL;
						} else {
							if (uri->absolutePath) {
								/* First and only segment -> update head
								 * OLD: head -> walker -> NULL
								 * NEW: head -----------> NULL */
								uri->pathHead = NULL;

								/* Last segment -> update tail
								 * OLD: tail -> walker
								 * NEW: tail -> NULL */
								uri->pathTail = NULL;
							} else {
								/* Re-use segment for "" path segment to represent trailing slash,
								 * then update head and tail */
								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
								freeWalker = URI_FALSE;
							}
						}

						if (freeWalker) {
							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);
						}

						walker = anotherNextBackup;
					}
				}
			}
			break;
		} /* end of switch */

		if (!removeSegment) {
			/* .. then let's move to the next element, and start again. */
			if (walker->next != NULL) {
				walker->next->reserved = walker;
			} else {
				/* Last segment -> update tail */
				uri->pathTail = walker;
			}
			walker = walker->next;
		}
	} while (walker != NULL);

	return URI_TRUE;
}